

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

void reloc_hunk(GlobalVars *gv,FILE *f,LinkedSection *sec,uint32_t relhunk,uint8_t rtype,
               uint16_t rsize)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  void *pvVar5;
  void *__ptr;
  list *l;
  node *pnVar6;
  node *pnVar7;
  node *pnVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  
  pnVar7 = (sec->relocs).first;
  pvVar5 = alloc((long)gv->nsecs << 3);
  __ptr = alloczero((long)gv->nsecs << 2);
  if (0 < gv->nsecs) {
    lVar9 = 0;
    do {
      l = (list *)alloc(0x18);
      *(list **)((long)pvVar5 + lVar9 * 8) = l;
      initlist(l);
      lVar9 = lVar9 + 1;
    } while (lVar9 < gv->nsecs);
  }
  if (rsize == 0x18) {
    uVar10 = 6;
    uVar14 = 0x3ffffff;
    uVar13 = 0x3fffffc;
  }
  else if (rsize == 0xe) {
    uVar10 = 0x10;
    uVar13 = 0xfffc;
    uVar14 = 0xffff;
  }
  else {
    uVar13 = ~(-1L << ((byte)rsize & 0x3f));
    uVar10 = 0;
    uVar14 = uVar13;
  }
  pnVar6 = pnVar7->next;
  if (pnVar6 == (node *)0x0) {
    bVar4 = true;
    bVar11 = true;
  }
  else {
    bVar4 = true;
    bVar11 = false;
    do {
      pnVar8 = pnVar6;
      if ((((*(uint8_t *)&pnVar7[3].pred == rtype) &&
           (pnVar6 = pnVar7[3].next, pnVar6 != (node *)0x0)) &&
          ((uint)uVar10 == (uint)*(ushort *)&pnVar6->pred)) &&
         ((*(uint16_t *)((long)&pnVar6->pred + 2) == rsize &&
          (((ulong)pnVar6[1].next & uVar14) == uVar13)))) {
        remnode(pnVar7);
        addtail(*(list **)((long)pvVar5 + (long)*(int *)&pnVar7[1].pred[1].next * 8),pnVar7);
        pnVar6 = (node *)((long)&(pnVar7[2].next)->next + (uVar10 >> 3));
        pnVar7[2].next = pnVar6;
        lVar9 = (long)*(int *)&pnVar7[1].pred[1].next;
        iVar3 = *(int *)((long)__ptr + lVar9 * 4);
        *(int *)((long)__ptr + lVar9 * 4) = iVar3 + 1;
        if ((node *)0xffff < pnVar6) {
          bVar4 = false;
        }
        if (0xfffe < iVar3) {
          bVar4 = false;
        }
        bVar11 = true;
      }
      pnVar6 = pnVar8->next;
      pnVar7 = pnVar8;
    } while (pnVar6 != (node *)0x0);
    bVar11 = !bVar11;
  }
  if (!bVar11) {
    if ((((relhunk == 0x3ec) && (gv->reloctab_format == '\x04')) && (bVar4)) ||
       ((relhunk == 0x3fd && (gv->dest_object == 0)))) {
      if (!bVar4) {
        if (0 < gv->nsecs) {
          lVar9 = 0;
          do {
            while (pnVar7 = remhead(*(list **)((long)pvVar5 + lVar9 * 8)), pnVar7 != (node *)0x0) {
              addtail(&sec->relocs,pnVar7);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < gv->nsecs);
        }
        goto LAB_001189bb;
      }
      uVar12 = 0x3f7;
      if (relhunk != 0x3ec || gv->dest_object != 0) {
        uVar12 = relhunk;
      }
      fwrite32be(f,uVar12);
      if (0 < gv->nsecs) {
        lVar9 = 0;
        bVar11 = false;
        do {
          iVar3 = *(int *)((long)__ptr + lVar9 * 4);
          if (iVar3 != 0) {
            fwrite16be(f,(uint16_t)iVar3);
            fwrite16be(f,(uint16_t)lVar9);
            while (pnVar7 = remhead(*(list **)((long)pvVar5 + lVar9 * 8)), pnVar7 != (node *)0x0) {
              fwrite16be(f,*(uint16_t *)&pnVar7[2].next);
              bVar11 = (bool)(bVar11 ^ 1);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < gv->nsecs);
        if (bVar11) {
          fwrite16be(f,0);
          goto LAB_001189bb;
        }
      }
    }
    else {
      fwrite32be(f,relhunk);
      if (0 < gv->nsecs) {
        lVar9 = 0;
        do {
          while (uVar12 = *(uint32_t *)((long)__ptr + lVar9 * 4), uVar12 != 0) {
            if (0xffff < (int)uVar12) {
              uVar12 = 0x10000;
            }
            fwrite32be(f,uVar12);
            fwrite32be(f,(uint32_t)lVar9);
            piVar2 = (int *)((long)__ptr + lVar9 * 4);
            *piVar2 = *piVar2 - uVar12;
            do {
              pnVar7 = remhead(*(list **)((long)pvVar5 + lVar9 * 8));
              if (pnVar7 != (node *)0x0) {
                fwrite32be(f,*(uint32_t *)&pnVar7[2].next);
              }
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < gv->nsecs);
      }
    }
    fwrite32be(f,0);
  }
LAB_001189bb:
  if (0 < gv->nsecs) {
    lVar9 = 0;
    do {
      lVar1 = lVar9 * 8;
      lVar9 = lVar9 + 1;
      free(*(void **)((long)pvVar5 + lVar1));
    } while (lVar9 < gv->nsecs);
  }
  free(__ptr);
  return;
}

Assistant:

static void reloc_hunk(struct GlobalVars *gv,FILE *f,
                       struct LinkedSection *sec,uint32_t relhunk,
                       uint8_t rtype,uint16_t rsize)
/* generate an AmigaDOS/EHF relocation hunk for a specific reloc type */
{
  struct Reloc *nextrel,*rel=(struct Reloc *)sec->relocs.first;
  struct list **rlist=alloc(gv->nsecs*sizeof(struct list *));
  int *rcnt=alloczero(gv->nsecs*sizeof(int)); /* reloc cnt for all sect. */
  bool hunk_required=FALSE,small_offsets=TRUE;
  lword chkmask,rmask=makemask(rsize);
  uint16_t rpos=0;
  int i;

  for (i=0; i<gv->nsecs; i++) {  /* empty reloc lists for each section */
    rlist[i] = alloc(sizeof(struct list));
    initlist(rlist[i]);
  }

  /* EHF-PowerPC relocations need special treatment */
  if (rsize == 24) {
    rpos = 6;
    rmask = 0x3ffffff;
    chkmask = 0x3fffffc;
  }
  else if (rsize == 14) {
    rpos = 16;
    rmask = 0xffff;
    chkmask = 0xfffc;
  }
  else
    chkmask = rmask;

  while (nextrel = (struct Reloc *)rel->n.next) {
    struct RelocInsert *ri;
    int newrcnt;

    if (rel->rtype==rtype && (ri=rel->insert)!=NULL) {
      if (ri->bpos==rpos && ri->bsiz==rsize && (ri->mask&rmask)==chkmask) {
        /* move reloc node of correct type into relocssect's rlist */
        remnode(&rel->n);
        addtail(rlist[rel->relocsect.lnk->index],&rel->n);
        rel->offset += rpos >> 3;
        if (++rcnt[rel->relocsect.lnk->index] >= 0x10000 ||
            rel->offset >= 0x10000)
          small_offsets = FALSE; /* no short-reloc hunk would be possible */
        hunk_required = TRUE;
      }
    }
    rel = nextrel;
  }

  if (hunk_required) {  /* there's at least one relocation */

    if ((relhunk==HUNK_ABSRELOC32 &&
         gv->reloctab_format==RTAB_SHORTOFF && small_offsets) ||
        (relhunk==HUNK_RELRELOC32 && !gv->dest_object)) {
      /* Make a short hunk with 16-bit offsets.
         For executables, HUNK_DREL32 is used instead of the correct
         HUNK_RELOC32SHORT to be compatible with OS2.0.
         Due to a bug in OS3.x HUNK_RELRELOC32 requires 16-bit offsets
         in executables. */
      int cnt=0;

      if (!small_offsets) {
        /* cannot represent those relocs, so put them back */
        for (i=0; i<gv->nsecs; i++) {
          while (rel = (struct Reloc *)remhead(rlist[i]))
            addtail(&sec->relocs,&rel->n);
        }
        goto free_rlists;
      }
      if (!gv->dest_object && relhunk==HUNK_ABSRELOC32)
        relhunk = HUNK_DREL32;
      fwrite32be(f,relhunk);  /* reloc hunk id */

      for (i=0; i<gv->nsecs; i++) {
        if (rcnt[i]) {
          fwrite16be(f,(uint16_t)rcnt[i]);  /* number of relocations */
          fwrite16be(f,(uint16_t)i);  /* section index */
          cnt += 2;

          /* store relocation offsets */
          while (rel = (struct Reloc *)remhead(rlist[i])) {
            fwrite16be(f,(uint16_t)rel->offset);
            cnt++;
          }
        }
      }
      /* no more relocation entries */
      if (cnt & 1)  /* 0-word for 32-bit alignment */
        fwrite16be(f,0);
      else
        fwrite32be(f,0);
    }

    else {
      /* all other relocation hunks */
      fwrite32be(f,relhunk);  /* reloc hunk id */
      for (i=0; i<gv->nsecs; i++) {
        while (rcnt[i]) {
          /* never write more than 65536 relocs at once - there is a bug */
          /* in dos.library which rejects the executable file otherwise */
          int n = (rcnt[i]>0x10000) ? 0x10000 : rcnt[i];

          fwrite32be(f,(uint32_t)n);  /* number of relocations */
          fwrite32be(f,(uint32_t)i);  /* section index */
          rcnt[i] -= n;

          /* store relocation offsets */
          while (n--) {
            if (rel = (struct Reloc *)remhead(rlist[i])) {
              fwrite32be(f,(uint32_t)rel->offset);
            }
          }
        }
      }
      fwrite32be(f,0);  /* no more relocation entries */
    }
  }

  free_rlists:
  /* free dynamically allocated rlists and rcnt array */
  for (i=0; i<gv->nsecs; free(rlist[i++]));
  free(rcnt);
}